

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAdapter.cpp
# Opt level: O3

DirectionalAtypeParameters * __thiscall
OpenMD::DirectionalAdapter::getDirectionalParam
          (DirectionalAtypeParameters *__return_storage_ptr__,DirectionalAdapter *this)

{
  bool bVar1;
  long lVar2;
  double (*padVar3) [3];
  uint i;
  double (*padVar4) [3];
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_50 [16];
  string local_40;
  
  bVar1 = AtomType::hasProperty(this->at_,(string *)DirectionalTypeID_abi_cxx11_);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "DirectionalAdapter::getDirectionalParam was passed an atomType (%s)\n\tthat does not appear to be a Directional atom.\n"
            );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "DirectionalAdapter::getDirectionalParam could not find Directional\n\tparameters for atomType %s.\n"
            );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) goto LAB_001b7ea8;
  }
  else {
LAB_001b7ea8:
    lVar2 = __dynamic_cast(local_50._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::DirectionalAtypeParameters>::typeinfo);
    if (lVar2 != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        }
      }
      goto LAB_001b7f4a;
    }
  }
  AtomType::getName_abi_cxx11_(&local_40,this->at_);
  snprintf(painCave.errMsg,2000,
           "DirectionalAdapter::getDirectionalParam could not convert\n\tGenericData to DirectionalAtypeData for atom type %s\n"
          );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar2 = 0;
LAB_001b7f4a:
  padVar3 = (double (*) [3])(lVar2 + 0x28);
  if ((DirectionalAtypeParameters *)padVar3 != __return_storage_ptr__) {
    lVar2 = 0;
    padVar4 = (double (*) [3])__return_storage_ptr__;
    do {
      lVar5 = 0;
      do {
        (((Mat3x3d *)*padVar4)->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
        data_[0][lVar5] =
             (((Mat3x3d *)*padVar3)->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
             .data_[0][lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      padVar4 = padVar4 + 1;
      padVar3 = padVar3 + 1;
    } while (lVar2 != 3);
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

DirectionalAtypeParameters DirectionalAdapter::getDirectionalParam() {
    if (!isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAdapter::getDirectionalParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a Directional atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data =
        at_->getPropertyByName(DirectionalTypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "DirectionalAdapter::getDirectionalParam could not find Directional\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<DirectionalAtypeData> directionalData =
        std::dynamic_pointer_cast<DirectionalAtypeData>(data);
    if (directionalData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAdapter::getDirectionalParam could not convert\n"
               "\tGenericData to DirectionalAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return directionalData->getData();
  }